

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int isDate(sqlite3_context *context,int argc,sqlite3_value **argv,DateTime *p)

{
  char cVar1;
  Mem *pVal;
  double dVar2;
  double dVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  size_t sVar8;
  sqlite3_int64 sVar9;
  sqlite3_int64 sVar10;
  long lVar11;
  char *pcVar12;
  byte bVar13;
  long lVar14;
  uint uVar15;
  uchar uVar16;
  uchar uVar17;
  uint uVar18;
  ulong uVar19;
  byte *__s;
  char *zDate;
  undefined4 uVar20;
  undefined4 uVar21;
  int M;
  int Y;
  double r;
  int local_ac;
  sqlite3_context *local_a8;
  undefined8 local_a0;
  double local_98;
  sqlite3_value **local_90;
  int local_84;
  double local_80;
  ulong local_78;
  ulong local_70;
  DateTime local_68;
  
  p->s = 0.0;
  p->validJD = '\0';
  p->rawS = '\0';
  p->validYMD = '\0';
  p->validHMS = '\0';
  p->validTZ = '\0';
  p->tzSet = '\0';
  p->isError = '\0';
  p->field_0x2f = 0;
  p->D = 0;
  p->h = 0;
  p->m = 0;
  p->tz = 0;
  p->iJD = 0;
  p->Y = 0;
  p->M = 0;
  if (argc == 0) {
    iVar5 = setDateTimeToCurrent(context,p);
    return iVar5;
  }
  pVal = *argv;
  local_a8 = context;
  local_90 = argv;
  if (1 < "\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x02\x05\x03\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x04\x05\x03\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05"
          [pVal->flags & 0x3f] - 1) {
    pcVar12 = (char *)sqlite3ValueText(pVal,'\x01');
    if (pcVar12 == (char *)0x0) {
      return 1;
    }
    cVar1 = *pcVar12;
    uVar19 = (ulong)(cVar1 == '-');
    iVar5 = getDigits(pcVar12 + uVar19,"40f-21a-21d",&local_a0,&local_ac,&local_84);
    if (iVar5 == 3) {
      zDate = pcVar12 + uVar19 + 9;
      do {
        do {
          pbVar7 = (byte *)(zDate + 1);
          zDate = zDate + 1;
        } while ((ulong)*pbVar7 == 0x54);
      } while ((""[*pbVar7] & 1) != 0);
      iVar5 = parseHhMmSs(zDate,p);
      if (iVar5 != 0) {
        context = local_a8;
        if (*zDate != '\0') goto LAB_001c1213;
        p->validHMS = '\0';
      }
      p->validJD = '\0';
      p->validYMD = '\x01';
      iVar5 = -(int)local_a0;
      if (cVar1 != '-') {
        iVar5 = (int)local_a0;
      }
      p->Y = iVar5;
      p->M = local_ac;
      p->D = local_84;
      argv = local_90;
      if (p->validTZ != '\0') {
        computeJD(p);
        argv = local_90;
      }
    }
    else {
LAB_001c1213:
      iVar5 = parseHhMmSs(pcVar12,p);
      argv = local_90;
      if (iVar5 != 0) {
        lVar14 = 0;
        do {
          bVar4 = pcVar12[lVar14];
          if (bVar4 == "now"[lVar14]) {
            if ((ulong)bVar4 == 0) goto LAB_001c1260;
          }
          else if (""[bVar4] != ""[(byte)"now"[lVar14]]) goto LAB_001c1286;
          lVar14 = lVar14 + 1;
        } while( true );
      }
    }
    goto LAB_001c12f8;
  }
  dVar2 = sqlite3VdbeRealValue(pVal);
  uVar20 = SUB84(dVar2,0);
  uVar21 = (undefined4)((ulong)dVar2 >> 0x20);
LAB_001c111d:
  p->s = (double)CONCAT44(uVar21,uVar20);
  p->rawS = '\x01';
  if ((0.0 <= (double)CONCAT44(uVar21,uVar20)) &&
     ((double)CONCAT44(uVar21,uVar20) <= 5373484.5 && (double)CONCAT44(uVar21,uVar20) != 5373484.5))
  {
    p->iJD = (long)((double)CONCAT44(uVar21,uVar20) * 86400000.0 + 0.5);
    p->validJD = '\x01';
  }
LAB_001c12f8:
  if (argc < 2) {
LAB_001c1b4f:
    computeJD(p);
    uVar18 = 1;
    if (p->isError == '\0') {
      uVar18 = (uint)(0x1a6401072fdff < (ulong)p->iJD);
    }
    return uVar18;
  }
  local_78 = (ulong)(uint)argc;
  uVar19 = 1;
LAB_001c1317:
  pbVar7 = (byte *)sqlite3ValueText(argv[uVar19],'\x01');
  sqlite3ValueBytes(argv[uVar19],'\x01');
  if (pbVar7 == (byte *)0x0) {
    return 1;
  }
  local_ac = 1;
  bVar4 = *pbVar7;
  bVar13 = ""[bVar4];
  local_70 = uVar19;
  if (bVar13 < 0x6c) {
    if (((bVar13 - 0x30 < 10) || (bVar13 == 0x2b)) || (bVar13 == 0x2d)) {
      lVar14 = 1;
      __s = pbVar7;
      while( true ) {
        bVar13 = pbVar7[lVar14];
        if (((bVar13 == 0) || (bVar13 == 0x3a)) || ((""[bVar13] & 1) != 0)) break;
        lVar14 = lVar14 + 1;
        __s = __s + 1;
      }
      iVar5 = sqlite3AtoF((char *)pbVar7,(double *)&local_a0,(int)lVar14,'\x01');
      if (iVar5 < 1) {
        return 1;
      }
      if (bVar13 == 0x3a) {
        local_68.s = 0.0;
        local_68.validJD = '\0';
        local_68.rawS = '\0';
        local_68.validYMD = '\0';
        local_68.validHMS = '\0';
        local_68.validTZ = '\0';
        local_68.tzSet = '\0';
        local_68.isError = '\0';
        local_68._47_1_ = 0;
        local_68.D = 0;
        local_68.h = 0;
        local_68.m = 0;
        local_68.tz = 0;
        local_68.iJD = 0;
        local_68.Y = 0;
        local_68.M = 0;
        iVar5 = parseHhMmSs((char *)(pbVar7 + ((ulong)bVar4 - 0x3a < 0xfffffffffffffff6)),&local_68)
        ;
        argv = local_90;
        if (iVar5 == 0) {
          computeJD(&local_68);
          lVar11 = (local_68.iJD + -43200000) % 86400000;
          lVar14 = -lVar11;
          if (*pbVar7 != 0x2d) {
            lVar14 = lVar11;
          }
          computeJD(p);
          p->validYMD = '\0';
          p->validHMS = '\0';
          p->validTZ = '\0';
          p->iJD = p->iJD + lVar14;
          local_ac = 0;
          argv = local_90;
        }
        goto LAB_001c1592;
      }
      do {
        pbVar7 = __s + 1;
        __s = __s + 1;
      } while ((""[*pbVar7] & 1) != 0);
      sVar8 = strlen((char *)__s);
      argv = local_90;
      uVar18 = (uint)sVar8 & 0x3fffffff;
      if (uVar18 - 0xb < 0xfffffff8) goto LAB_001c1592;
      if ((__s[uVar18 - 1] & 0xdf) == 0x53) {
        uVar18 = uVar18 - 1;
      }
      computeJD(p);
      dVar3 = (double)CONCAT44(local_a0._4_4_,(int)local_a0);
      local_ac = 1;
      dVar2 = *(double *)(&DAT_001e50f0 + (ulong)(dVar3 < 0.0) * 8);
      lVar14 = 0;
      do {
        if (uVar18 == aXformType[lVar14].nName) {
          if (aXformType[lVar14].zName != (char *)0x0) {
            lVar11 = 0;
            uVar15 = uVar18 + 1;
            do {
              uVar19 = (ulong)(byte)aXformType[lVar14].zName[lVar11];
              if (uVar19 == 0) {
                uVar17 = ""[__s[lVar11]];
                uVar16 = '\0';
LAB_001c1551:
                if (uVar16 != uVar17) goto LAB_001c157b;
                break;
              }
              uVar16 = ""[uVar19];
              uVar17 = ""[__s[lVar11]];
              if (uVar16 != uVar17) goto LAB_001c1551;
              uVar15 = uVar15 - 1;
              lVar11 = lVar11 + 1;
            } while (1 < uVar15);
            if ((-aXformType[lVar14].rLimit < dVar3) && (dVar3 < aXformType[lVar14].rLimit)) {
              local_98 = dVar3;
              local_80 = dVar2;
              if (aXformType[lVar14].eType == '\x02') {
                iVar5 = (int)dVar3;
                computeYMD(p);
                computeHMS(p);
                p->Y = p->Y + iVar5;
LAB_001c1b03:
                p->validJD = '\0';
                local_98 = local_98 - (double)iVar5;
              }
              else if (aXformType[lVar14].eType == '\x01') {
                computeYMD(p);
                computeHMS(p);
                iVar5 = (int)local_98;
                iVar6 = p->M + iVar5;
                if (iVar6 == 0 || SCARRY4(p->M,iVar5) != iVar6 < 0) {
                  uVar18 = -((0xcU - iVar6) / 0xc);
                }
                else {
                  uVar18 = (iVar6 - 1U) / 0xc;
                }
                p->Y = p->Y + uVar18;
                p->M = iVar6 + uVar18 * -0xc;
                goto LAB_001c1b03;
              }
              computeJD(p);
              p->iJD = p->iJD + (long)(local_98 * aXformType[lVar14].rXform + local_80);
              local_ac = 0;
              break;
            }
          }
        }
LAB_001c157b:
        lVar14 = lVar14 + 1;
      } while (lVar14 != 6);
      goto LAB_001c1588;
    }
    goto LAB_001c1592;
  }
  if (bVar13 < 0x75) {
    if (bVar13 == 0x6c) {
      lVar14 = 0;
      do {
        if (bVar4 == "localtime"[lVar14]) {
          if (bVar4 == 0) goto LAB_001c1757;
        }
        else if (""[bVar4] != ""[(byte)"localtime"[lVar14]]) goto LAB_001c1592;
        bVar4 = pbVar7[lVar14 + 1];
        lVar14 = lVar14 + 1;
      } while( true );
    }
    if (bVar13 == 0x73) {
      uVar16 = '\0';
      if (bVar4 == 0) {
        pcVar12 = "start of ";
      }
      else {
        lVar14 = 0;
        do {
          lVar11 = lVar14;
          uVar16 = ""[bVar4];
          if (uVar16 != ""[(byte)"start of "[lVar11]]) {
            pcVar12 = "start of " + lVar11;
            goto LAB_001c19cd;
          }
          if (lVar11 == 8) goto LAB_001c19dd;
          bVar4 = pbVar7[lVar11 + 1];
          lVar14 = lVar11 + 1;
        } while (bVar4 != 0);
        pcVar12 = "start of " + lVar11 + 1;
        uVar16 = '\0';
      }
LAB_001c19cd:
      if (uVar16 == ""[(byte)*pcVar12]) {
LAB_001c19dd:
        if (((p->validJD != '\0') || (p->validYMD != '\0')) || (p->validHMS != '\0')) {
          computeYMD(p);
          p->validHMS = '\x01';
          p->validTZ = '\0';
          p->h = 0;
          p->m = 0;
          p->s = 0.0;
          p->validJD = '\0';
          p->rawS = '\0';
          lVar14 = 0;
          do {
            bVar4 = pbVar7[lVar14 + 9];
            if (bVar4 == "month"[lVar14]) {
              if ((ulong)bVar4 == 0) goto LAB_001c1a45;
            }
            else if (""[bVar4] != ""[(byte)"month"[lVar14]]) {
              lVar14 = 0;
              goto LAB_001c1a53;
            }
            lVar14 = lVar14 + 1;
          } while( true );
        }
      }
    }
    goto LAB_001c1592;
  }
  if (bVar13 != 0x77) {
    if (bVar13 == 0x75) {
      lVar14 = 0;
      bVar13 = bVar4;
      do {
        if (bVar13 == "unixepoch"[lVar14]) {
          if (bVar13 == 0) goto LAB_001c178c;
        }
        else if (""[bVar13] != ""[(byte)"unixepoch"[lVar14]]) goto LAB_001c17e0;
        bVar13 = pbVar7[lVar14 + 1];
        lVar14 = lVar14 + 1;
      } while( true );
    }
    goto LAB_001c1592;
  }
  uVar16 = '\0';
  if (bVar4 == 0) {
    pcVar12 = "weekday ";
  }
  else {
    lVar14 = 0;
    do {
      lVar11 = lVar14;
      uVar16 = ""[bVar4];
      if (uVar16 != ""[(byte)"weekday "[lVar11]]) {
        pcVar12 = "weekday " + lVar11;
        goto LAB_001c18a4;
      }
      if (lVar11 == 7) goto LAB_001c18b4;
      bVar4 = pbVar7[lVar11 + 1];
      lVar14 = lVar11 + 1;
    } while (bVar4 != 0);
    pcVar12 = "weekday " + lVar11 + 1;
    uVar16 = '\0';
  }
LAB_001c18a4:
  if (uVar16 != ""[(byte)*pcVar12]) goto LAB_001c1592;
LAB_001c18b4:
  sVar8 = strlen((char *)(pbVar7 + 8));
  iVar5 = sqlite3AtoF((char *)(pbVar7 + 8),(double *)&local_a0,(uint)sVar8 & 0x3fffffff,'\x01');
  if (((iVar5 < 1) || (dVar2 = (double)CONCAT44(local_a0._4_4_,(int)local_a0), 7.0 <= dVar2)) ||
     ((uVar18 = (uint)dVar2, (int)uVar18 < 0 ||
      ((dVar2 != (double)(int)dVar2 || (NAN(dVar2) || NAN((double)(int)dVar2)))))))
  goto LAB_001c1592;
  computeYMD(p);
  computeHMS(p);
  p->validTZ = '\0';
  p->validJD = '\0';
  computeJD(p);
  lVar14 = (p->iJD + 0x7b98a00) / 86400000;
  lVar11 = (lVar14 / 7) * -7 + -7 + lVar14;
  if (lVar14 % 7 <= (long)(ulong)uVar18) {
    lVar11 = lVar14 % 7;
  }
  p->iJD = ((ulong)uVar18 - lVar11) * 86400000 + p->iJD;
  p->validYMD = '\0';
  p->validHMS = '\0';
  p->validTZ = '\0';
  goto LAB_001c159d;
LAB_001c1260:
  iVar5 = sqlite3NotPureFunc(context);
  if (iVar5 != 0) {
    iVar5 = setDateTimeToCurrent(context,p);
    if (iVar5 != 0) {
      return 1;
    }
    goto LAB_001c12f8;
  }
LAB_001c1286:
  sVar8 = strlen(pcVar12);
  iVar5 = sqlite3AtoF(pcVar12,(double *)&local_68,(uint)sVar8 & 0x3fffffff,'\x01');
  if (iVar5 < 1) {
    return 1;
  }
  uVar20 = (undefined4)local_68.iJD;
  uVar21 = (undefined4)((ulong)local_68.iJD >> 0x20);
  goto LAB_001c111d;
LAB_001c1757:
  iVar5 = sqlite3NotPureFunc(local_a8);
  if (iVar5 != 0) {
    computeJD(p);
    sVar9 = localtimeOffset(p,local_a8,&local_ac);
    p->iJD = p->iJD + sVar9;
LAB_001c1588:
    p->validYMD = '\0';
    p->validHMS = '\0';
    p->validTZ = '\0';
  }
LAB_001c1592:
  if (local_ac != 0) {
    return 1;
  }
LAB_001c159d:
  uVar19 = local_70 + 1;
  if (uVar19 == local_78) goto LAB_001c1b4f;
  goto LAB_001c1317;
LAB_001c1a53:
  bVar4 = pbVar7[lVar14 + 9];
  if (bVar4 == "year"[lVar14]) {
    if ((ulong)bVar4 == 0) goto LAB_001c1a98;
  }
  else if (""[bVar4] != ""[(byte)"year"[lVar14]]) {
    lVar14 = 0;
    goto LAB_001c1aad;
  }
  lVar14 = lVar14 + 1;
  goto LAB_001c1a53;
LAB_001c1aad:
  bVar4 = pbVar7[lVar14 + 9];
  if (bVar4 == "julianday"[lVar14 + 6]) {
    if ((ulong)bVar4 == 0) goto LAB_001c159d;
  }
  else if (""[bVar4] != ""[(byte)"julianday"[lVar14 + 6]]) goto LAB_001c1592;
  lVar14 = lVar14 + 1;
  goto LAB_001c1aad;
LAB_001c1a98:
  p->M = 1;
  p->D = 1;
  goto LAB_001c159d;
LAB_001c1a45:
  p->D = 1;
  goto LAB_001c159d;
LAB_001c178c:
  if (p->rawS == '\0') {
LAB_001c17e0:
    lVar14 = 0;
    do {
      if (bVar4 == "utc"[lVar14]) {
        if (bVar4 == 0) goto LAB_001c182a;
      }
      else if (""[bVar4] != ""[(byte)"utc"[lVar14]]) goto LAB_001c1592;
      bVar4 = pbVar7[lVar14 + 1];
      lVar14 = lVar14 + 1;
    } while( true );
  }
  dVar2 = p->s * 1000.0 + 210866760000000.0;
  if ((0.0 <= dVar2) && (dVar2 < 464269060800000.0)) {
    p->validTZ = '\0';
    p->iJD = (long)dVar2;
    p->validJD = '\x01';
    p->rawS = '\0';
    p->validYMD = '\0';
    p->validHMS = '\0';
    goto LAB_001c159d;
  }
  goto LAB_001c1592;
LAB_001c182a:
  iVar5 = sqlite3NotPureFunc(local_a8);
  if (iVar5 != 0) {
    if (p->tzSet != '\0') goto LAB_001c159d;
    computeJD(p);
    sVar9 = localtimeOffset(p,local_a8,&local_ac);
    if (local_ac == 0) {
      p->iJD = p->iJD - sVar9;
      p->validYMD = '\0';
      p->validHMS = '\0';
      p->validTZ = '\0';
      sVar10 = localtimeOffset(p,local_a8,&local_ac);
      p->iJD = p->iJD + (sVar9 - sVar10);
    }
    p->tzSet = '\x01';
  }
  goto LAB_001c1592;
}

Assistant:

static int isDate(
  sqlite3_context *context, 
  int argc, 
  sqlite3_value **argv, 
  DateTime *p
){
  int i, n;
  const unsigned char *z;
  int eType;
  memset(p, 0, sizeof(*p));
  if( argc==0 ){
    return setDateTimeToCurrent(context, p);
  }
  if( (eType = sqlite3_value_type(argv[0]))==SQLITE_FLOAT
                   || eType==SQLITE_INTEGER ){
    setRawDateNumber(p, sqlite3_value_double(argv[0]));
  }else{
    z = sqlite3_value_text(argv[0]);
    if( !z || parseDateOrTime(context, (char*)z, p) ){
      return 1;
    }
  }
  for(i=1; i<argc; i++){
    z = sqlite3_value_text(argv[i]);
    n = sqlite3_value_bytes(argv[i]);
    if( z==0 || parseModifier(context, (char*)z, n, p) ) return 1;
  }
  computeJD(p);
  if( p->isError || !validJulianDay(p->iJD) ) return 1;
  return 0;
}